

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O3

void __thiscall QAnimationTimer::updateAnimationsTime(QAnimationTimer *this,qint64 delta)

{
  QAbstractAnimation *this_00;
  parameter_type pVar1;
  parameter_type pVar2;
  int iVar3;
  long lVar4;
  
  if ((this[0x24] == (QAnimationTimer)0x0) &&
     (*(long *)(this + 0x18) = *(long *)(this + 0x18) + delta, delta != 0)) {
    this[0x24] = (QAnimationTimer)0x1;
    *(undefined4 *)(this + 0x20) = 0;
    if (*(long *)(this + 0x38) != 0) {
      lVar4 = 0;
      do {
        this_00 = *(QAbstractAnimation **)(*(long *)(this + 0x30) + lVar4 * 8);
        pVar1 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                         *)(*(long *)(this_00 + 8) + 0x80));
        pVar2 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
                         *)(*(long *)(this_00 + 8) + 0x7c));
        iVar3 = -(int)delta;
        if (pVar2 == Forward) {
          iVar3 = (int)delta;
        }
        QAbstractAnimation::setCurrentTime(this_00,pVar1 + iVar3);
        lVar4 = (long)*(int *)(this + 0x20) + 1;
        *(int *)(this + 0x20) = (int)lVar4;
      } while (lVar4 < *(long *)(this + 0x38));
    }
    *(undefined4 *)(this + 0x20) = 0;
    this[0x24] = (QAnimationTimer)0x0;
  }
  return;
}

Assistant:

void QAnimationTimer::updateAnimationsTime(qint64 delta)
{
    //setCurrentTime can get this called again while we're the for loop. At least with pauseAnimations
    if (insideTick)
        return;

    lastTick += delta;

    //we make sure we only call update time if the time has actually changed
    //it might happen in some cases that the time doesn't change because events are delayed
    //when the CPU load is high
    if (delta) {
        QScopedValueRollback<bool> guard(insideTick, true);
        for (currentAnimationIdx = 0; currentAnimationIdx < animations.size(); ++currentAnimationIdx) {
            QAbstractAnimation *animation = animations.at(currentAnimationIdx);
            int elapsed = QAbstractAnimationPrivate::get(animation)->totalCurrentTime
                          + (animation->direction() == QAbstractAnimation::Forward ? delta : -delta);
            animation->setCurrentTime(elapsed);
        }
        currentAnimationIdx = 0;
    }
}